

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decodeLiteralsBlock
                 (ZSTD_DCtx *dctx,void *src,size_t srcSize,void *dst,size_t dstCapacity,
                 streaming_operation streaming)

{
  int iVar1;
  U16 UVar2;
  uint uVar3;
  uint uVar4;
  U32 UVar5;
  int iVar6;
  HUF_DTable *dctx_00;
  void *pvVar7;
  void *in_RCX;
  ulong in_RDX;
  byte *in_RSI;
  ZSTD_DCtx_s *in_RDI;
  void *in_R8;
  streaming_operation in_R9D;
  bool bVar8;
  size_t expectedWriteSize_2;
  size_t lhSize_2;
  size_t litSize_2;
  U32 lhlCode_2;
  size_t expectedWriteSize_1;
  U32 lhlCode_1;
  size_t lhSize_1;
  size_t litSize_1;
  size_t _pos;
  size_t _size;
  char *_ptr;
  int flags;
  size_t expectedWriteSize;
  size_t hufSuccess;
  U32 lhc;
  U32 lhlCode;
  U32 singleStream;
  size_t litCSize;
  size_t litSize;
  size_t lhSize;
  symbolEncodingType_e litEncType;
  BYTE *istart;
  void *in_stack_fffffffffffffed8;
  int flags_00;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  size_t in_stack_fffffffffffffee8;
  void *in_stack_fffffffffffffef0;
  void *pvVar9;
  size_t in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  long lVar10;
  size_t in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  long local_b0;
  void *local_a8;
  ulong local_a0;
  size_t local_78;
  ulong local_60;
  void *local_58;
  long local_50;
  size_t local_8;
  
  if (in_RDX < 2) {
    return 0xffffffffffffffec;
  }
  uVar3 = *in_RSI & 3;
  dctx_00 = (HUF_DTable *)(ulong)uVar3;
  switch(dctx_00) {
  case (HUF_DTable *)0x0:
    pvVar9 = in_R8;
    if ((void *)0x20000 < in_R8) {
      pvVar9 = (void *)0x20000;
    }
    switch((int)(uint)*in_RSI >> 2 & 3) {
    case 0:
    case 2:
    default:
      local_b0 = 1;
      local_a8 = (void *)(long)((int)(uint)*in_RSI >> 3);
      break;
    case 1:
      local_b0 = 2;
      UVar2 = MEM_readLE16(in_stack_fffffffffffffed8);
      local_a8 = (void *)(long)((int)(uint)UVar2 >> 4);
      break;
    case 3:
      local_b0 = 3;
      if (in_RDX < 3) {
        return 0xffffffffffffffec;
      }
      UVar5 = MEM_readLE24((void *)0x2f9e32);
      local_a8 = (void *)(ulong)(UVar5 >> 4);
    }
    if ((local_a8 != (void *)0x0) && (in_RCX == (void *)0x0)) {
      return 0xffffffffffffffba;
    }
    if (pvVar9 < local_a8) {
      return 0xffffffffffffffba;
    }
    ZSTD_allocateLiteralsBuffer
              (in_RDI,in_RCX,(size_t)in_R8,(size_t)local_a8,in_R9D,(size_t)pvVar9,1);
    if (in_RDX < (ulong)((long)local_a8 + local_b0 + 0x20)) {
      if (in_RDX < (ulong)((long)local_a8 + local_b0)) {
        return 0xffffffffffffffec;
      }
      if (in_RDI->litBufferLocation == ZSTD_split) {
        memcpy(in_RDI->litBuffer,in_RSI + local_b0,(long)local_a8 - 0x10000);
        memcpy(in_RDI->litExtraBuffer,in_RSI + local_b0 + (long)local_a8 + -0x10000,0x10000);
      }
      else {
        memcpy(in_RDI->litBuffer,in_RSI + local_b0,(size_t)local_a8);
      }
      in_RDI->litPtr = in_RDI->litBuffer;
      in_RDI->litSize = (size_t)local_a8;
      return local_b0 + (long)local_a8;
    }
    in_RDI->litPtr = in_RSI + local_b0;
    in_RDI->litSize = (size_t)local_a8;
    in_RDI->litBufferEnd = in_RDI->litPtr + (long)local_a8;
    in_RDI->litBufferLocation = ZSTD_not_in_dst;
    return local_b0 + (long)local_a8;
  case (HUF_DTable *)0x1:
    pvVar9 = in_R8;
    if ((void *)0x20000 < in_R8) {
      pvVar9 = (void *)0x20000;
    }
    switch((int)(uint)*in_RSI >> 2 & 3) {
    case 0:
    case 2:
    default:
      lVar10 = 1;
      pvVar7 = (void *)(long)((int)(uint)*in_RSI >> 3);
      break;
    case 1:
      lVar10 = 2;
      if (in_RDX < 3) {
        return 0xffffffffffffffec;
      }
      UVar2 = MEM_readLE16(in_stack_fffffffffffffed8);
      pvVar7 = (void *)(long)((int)(uint)UVar2 >> 4);
      break;
    case 3:
      lVar10 = 3;
      if (in_RDX < 4) {
        return 0xffffffffffffffec;
      }
      UVar5 = MEM_readLE24((void *)0x2fa17b);
      pvVar7 = (void *)(ulong)(UVar5 >> 4);
    }
    if ((pvVar7 != (void *)0x0) && (in_RCX == (void *)0x0)) {
      return 0xffffffffffffffba;
    }
    if ((void *)0x20000 < pvVar7) {
      return 0xffffffffffffffec;
    }
    if (pvVar9 < pvVar7) {
      return 0xffffffffffffffba;
    }
    ZSTD_allocateLiteralsBuffer(in_RDI,in_RCX,(size_t)in_R8,(size_t)pvVar7,in_R9D,(size_t)pvVar9,1);
    if (in_RDI->litBufferLocation == ZSTD_split) {
      memset(in_RDI->litBuffer,(uint)in_RSI[lVar10],(long)pvVar7 - 0x10000);
      memset(in_RDI->litExtraBuffer,(uint)in_RSI[lVar10],0x10000);
    }
    else {
      memset(in_RDI->litBuffer,(uint)in_RSI[lVar10],(size_t)pvVar7);
    }
    in_RDI->litPtr = in_RDI->litBuffer;
    in_RDI->litSize = (size_t)pvVar7;
    return lVar10 + 1;
  case (HUF_DTable *)0x2:
    goto switchD_002f9691_caseD_2;
  case (HUF_DTable *)0x3:
    break;
  default:
    return 0xffffffffffffffec;
  }
  if (in_RDI->litEntropy == 0) {
    return 0xffffffffffffffe2;
  }
switchD_002f9691_caseD_2:
  if (in_RDX < 5) {
    return 0xffffffffffffffec;
  }
  bVar8 = false;
  uVar4 = (int)(uint)*in_RSI >> 2 & 3;
  UVar5 = MEM_readLE32(in_stack_fffffffffffffed8);
  flags_00 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  pvVar9 = in_R8;
  if ((void *)0x20000 < in_R8) {
    pvVar9 = (void *)0x20000;
  }
  pvVar7 = pvVar9;
  iVar6 = ZSTD_DCtx_get_bmi2(in_RDI);
  iVar1 = in_RDI->disableHufAsm;
  if (1 < uVar4) {
    if (uVar4 == 2) {
      local_50 = 4;
      local_58 = (void *)(ulong)(UVar5 >> 4 & 0x3fff);
      local_60 = (ulong)(UVar5 >> 0x12);
      goto LAB_002f9887;
    }
    if (uVar4 == 3) {
      local_50 = 5;
      local_58 = (void *)(ulong)(UVar5 >> 4 & 0x3ffff);
      local_60 = (ulong)(UVar5 >> 0x16) + (ulong)in_RSI[4] * 0x400;
      goto LAB_002f9887;
    }
  }
  bVar8 = uVar4 == 0;
  local_50 = 3;
  local_58 = (void *)(ulong)(UVar5 >> 4 & 0x3ff);
  local_60 = (ulong)(UVar5 >> 0xe & 0x3ff);
LAB_002f9887:
  if ((local_58 == (void *)0x0) || (in_RCX != (void *)0x0)) {
    if (local_58 < (void *)0x20001) {
      if ((bVar8) || ((void *)0x5 < local_58)) {
        if (in_RDX < local_60 + local_50) {
          local_8 = 0xffffffffffffffec;
        }
        else if (pvVar9 < local_58) {
          local_8 = 0xffffffffffffffba;
        }
        else {
          ZSTD_allocateLiteralsBuffer
                    (in_RDI,in_RCX,(size_t)in_R8,(size_t)local_58,in_R9D,(size_t)pvVar9,0);
          if ((in_RDI->ddictIsCold != 0) && ((void *)0x300 < local_58)) {
            for (local_a0 = 0; local_a0 < 0x4004; local_a0 = local_a0 + 0x40) {
            }
          }
          if (uVar3 == 3) {
            if (bVar8) {
              local_78 = HUF_decompress1X_usingDTable
                                   (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                                    in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                                    (HUF_DTable *)
                                    CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                    flags_00);
            }
            else {
              if (local_58 < (void *)0x6) {
                __assert_fail("litSize >= MIN_LITERALS_FOR_4_STREAMS",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa53e,
                              "size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx *, const void *, size_t, void *, size_t, const streaming_operation)"
                             );
              }
              local_78 = HUF_decompress4X_usingDTable
                                   (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                                    in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                                    (HUF_DTable *)
                                    CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                    flags_00);
            }
          }
          else if (bVar8) {
            local_78 = HUF_decompress1X1_DCtx_wksp
                                 ((HUF_DTable *)CONCAT44(uVar4,in_stack_ffffffffffffff08),
                                  in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                                  in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                                  (void *)CONCAT44(in_stack_fffffffffffffee4,
                                                   (uint)(iVar6 != 0) | (uint)(iVar1 != 0) << 4),
                                  in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
          }
          else {
            local_78 = HUF_decompress4X_hufOnly_wksp
                                 (dctx_00,pvVar7,CONCAT44(uVar4,in_stack_ffffffffffffff08),
                                  in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                                  in_stack_fffffffffffffef0,in_stack_ffffffffffffff30,
                                  in_stack_ffffffffffffff38);
          }
          if (in_RDI->litBufferLocation == ZSTD_split) {
            memcpy(in_RDI->litExtraBuffer,in_RDI->litBufferEnd + -0x10000,0x10000);
            memmove(in_RDI->litBuffer + 0xffe0,in_RDI->litBuffer,(long)local_58 - 0x10000);
            in_RDI->litBuffer = in_RDI->litBuffer + 0xffe0;
            in_RDI->litBufferEnd = in_RDI->litBufferEnd + -0x20;
          }
          uVar4 = ERR_isError(local_78);
          if (uVar4 == 0) {
            in_RDI->litPtr = in_RDI->litBuffer;
            in_RDI->litSize = (size_t)local_58;
            in_RDI->litEntropy = 1;
            if (uVar3 == 2) {
              in_RDI->HUFptr = (in_RDI->entropy).hufTable;
            }
            local_8 = local_60 + local_50;
          }
          else {
            local_8 = 0xffffffffffffffec;
          }
        }
      }
      else {
        local_8 = 0xffffffffffffffe8;
      }
    }
    else {
      local_8 = 0xffffffffffffffec;
    }
  }
  else {
    local_8 = 0xffffffffffffffba;
  }
  return local_8;
}

Assistant:

size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx* dctx,
                          const void* src, size_t srcSize,   /* note : srcSize < BLOCKSIZE */
                          void* dst, size_t dstCapacity, const streaming_operation streaming)
{
    DEBUGLOG(5, "ZSTD_decodeLiteralsBlock");
    RETURN_ERROR_IF(srcSize < MIN_CBLOCK_SIZE, corruption_detected, "");

    {   const BYTE* const istart = (const BYTE*) src;
        symbolEncodingType_e const litEncType = (symbolEncodingType_e)(istart[0] & 3);

        switch(litEncType)
        {
        case set_repeat:
            DEBUGLOG(5, "set_repeat flag : re-using stats from previous compressed literals block");
            RETURN_ERROR_IF(dctx->litEntropy==0, dictionary_corrupted, "");
            ZSTD_FALLTHROUGH;

        case set_compressed:
            RETURN_ERROR_IF(srcSize < 5, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need up to 5 for case 3");
            {   size_t lhSize, litSize, litCSize;
                U32 singleStream=0;
                U32 const lhlCode = (istart[0] >> 2) & 3;
                U32 const lhc = MEM_readLE32(istart);
                size_t hufSuccess;
                size_t expectedWriteSize = MIN(ZSTD_BLOCKSIZE_MAX, dstCapacity);
                int const flags = 0
                    | (ZSTD_DCtx_get_bmi2(dctx) ? HUF_flags_bmi2 : 0)
                    | (dctx->disableHufAsm ? HUF_flags_disableAsm : 0);
                switch(lhlCode)
                {
                case 0: case 1: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    /* 2 - 2 - 10 - 10 */
                    singleStream = !lhlCode;
                    lhSize = 3;
                    litSize  = (lhc >> 4) & 0x3FF;
                    litCSize = (lhc >> 14) & 0x3FF;
                    break;
                case 2:
                    /* 2 - 2 - 14 - 14 */
                    lhSize = 4;
                    litSize  = (lhc >> 4) & 0x3FFF;
                    litCSize = lhc >> 18;
                    break;
                case 3:
                    /* 2 - 2 - 18 - 18 */
                    lhSize = 5;
                    litSize  = (lhc >> 4) & 0x3FFFF;
                    litCSize = (lhc >> 22) + ((size_t)istart[4] << 10);
                    break;
                }
                RETURN_ERROR_IF(litSize > 0 && dst == NULL, dstSize_tooSmall, "NULL not handled");
                RETURN_ERROR_IF(litSize > ZSTD_BLOCKSIZE_MAX, corruption_detected, "");
                if (!singleStream)
                    RETURN_ERROR_IF(litSize < MIN_LITERALS_FOR_4_STREAMS, literals_headerWrong,
                        "Not enough literals (%zu) for the 4-streams mode (min %u)",
                        litSize, MIN_LITERALS_FOR_4_STREAMS);
                RETURN_ERROR_IF(litCSize + lhSize > srcSize, corruption_detected, "");
                RETURN_ERROR_IF(expectedWriteSize < litSize , dstSize_tooSmall, "");
                ZSTD_allocateLiteralsBuffer(dctx, dst, dstCapacity, litSize, streaming, expectedWriteSize, 0);

                /* prefetch huffman table if cold */
                if (dctx->ddictIsCold && (litSize > 768 /* heuristic */)) {
                    PREFETCH_AREA(dctx->HUFptr, sizeof(dctx->entropy.hufTable));
                }

                if (litEncType==set_repeat) {
                    if (singleStream) {
                        hufSuccess = HUF_decompress1X_usingDTable(
                            dctx->litBuffer, litSize, istart+lhSize, litCSize,
                            dctx->HUFptr, flags);
                    } else {
                        assert(litSize >= MIN_LITERALS_FOR_4_STREAMS);
                        hufSuccess = HUF_decompress4X_usingDTable(
                            dctx->litBuffer, litSize, istart+lhSize, litCSize,
                            dctx->HUFptr, flags);
                    }
                } else {
                    if (singleStream) {
#if defined(HUF_FORCE_DECOMPRESS_X2)
                        hufSuccess = HUF_decompress1X_DCtx_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), flags);
#else
                        hufSuccess = HUF_decompress1X1_DCtx_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), flags);
#endif
                    } else {
                        hufSuccess = HUF_decompress4X_hufOnly_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), flags);
                    }
                }
                if (dctx->litBufferLocation == ZSTD_split)
                {
                    ZSTD_memcpy(dctx->litExtraBuffer, dctx->litBufferEnd - ZSTD_LITBUFFEREXTRASIZE, ZSTD_LITBUFFEREXTRASIZE);
                    ZSTD_memmove(dctx->litBuffer + ZSTD_LITBUFFEREXTRASIZE - WILDCOPY_OVERLENGTH, dctx->litBuffer, litSize - ZSTD_LITBUFFEREXTRASIZE);
                    dctx->litBuffer += ZSTD_LITBUFFEREXTRASIZE - WILDCOPY_OVERLENGTH;
                    dctx->litBufferEnd -= WILDCOPY_OVERLENGTH;
                }

                RETURN_ERROR_IF(HUF_isError(hufSuccess), corruption_detected, "");

                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                dctx->litEntropy = 1;
                if (litEncType==set_compressed) dctx->HUFptr = dctx->entropy.hufTable;
                return litCSize + lhSize;
            }

        case set_basic:
            {   size_t litSize, lhSize;
                U32 const lhlCode = ((istart[0]) >> 2) & 3;
                size_t expectedWriteSize = MIN(ZSTD_BLOCKSIZE_MAX, dstCapacity);
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    RETURN_ERROR_IF(srcSize<3, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need lhSize = 3");
                    litSize = MEM_readLE24(istart) >> 4;
                    break;
                }

                RETURN_ERROR_IF(litSize > 0 && dst == NULL, dstSize_tooSmall, "NULL not handled");
                RETURN_ERROR_IF(expectedWriteSize < litSize, dstSize_tooSmall, "");
                ZSTD_allocateLiteralsBuffer(dctx, dst, dstCapacity, litSize, streaming, expectedWriteSize, 1);
                if (lhSize+litSize+WILDCOPY_OVERLENGTH > srcSize) {  /* risk reading beyond src buffer with wildcopy */
                    RETURN_ERROR_IF(litSize+lhSize > srcSize, corruption_detected, "");
                    if (dctx->litBufferLocation == ZSTD_split)
                    {
                        ZSTD_memcpy(dctx->litBuffer, istart + lhSize, litSize - ZSTD_LITBUFFEREXTRASIZE);
                        ZSTD_memcpy(dctx->litExtraBuffer, istart + lhSize + litSize - ZSTD_LITBUFFEREXTRASIZE, ZSTD_LITBUFFEREXTRASIZE);
                    }
                    else
                    {
                        ZSTD_memcpy(dctx->litBuffer, istart + lhSize, litSize);
                    }
                    dctx->litPtr = dctx->litBuffer;
                    dctx->litSize = litSize;
                    return lhSize+litSize;
                }
                /* direct reference into compressed stream */
                dctx->litPtr = istart+lhSize;
                dctx->litSize = litSize;
                dctx->litBufferEnd = dctx->litPtr + litSize;
                dctx->litBufferLocation = ZSTD_not_in_dst;
                return lhSize+litSize;
            }

        case set_rle:
            {   U32 const lhlCode = ((istart[0]) >> 2) & 3;
                size_t litSize, lhSize;
                size_t expectedWriteSize = MIN(ZSTD_BLOCKSIZE_MAX, dstCapacity);
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    RETURN_ERROR_IF(srcSize<3, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need lhSize+1 = 3");
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    RETURN_ERROR_IF(srcSize<4, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need lhSize+1 = 4");
                    litSize = MEM_readLE24(istart) >> 4;
                    break;
                }
                RETURN_ERROR_IF(litSize > 0 && dst == NULL, dstSize_tooSmall, "NULL not handled");
                RETURN_ERROR_IF(litSize > ZSTD_BLOCKSIZE_MAX, corruption_detected, "");
                RETURN_ERROR_IF(expectedWriteSize < litSize, dstSize_tooSmall, "");
                ZSTD_allocateLiteralsBuffer(dctx, dst, dstCapacity, litSize, streaming, expectedWriteSize, 1);
                if (dctx->litBufferLocation == ZSTD_split)
                {
                    ZSTD_memset(dctx->litBuffer, istart[lhSize], litSize - ZSTD_LITBUFFEREXTRASIZE);
                    ZSTD_memset(dctx->litExtraBuffer, istart[lhSize], ZSTD_LITBUFFEREXTRASIZE);
                }
                else
                {
                    ZSTD_memset(dctx->litBuffer, istart[lhSize], litSize);
                }
                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                return lhSize+1;
            }
        default:
            RETURN_ERROR(corruption_detected, "impossible");
        }
    }
}